

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

nvpair_t * nvpair_create_stringv(char *name,char *valuefmt,__va_list_tag *valueap)

{
  int iVar1;
  nvpair_t *pnVar2;
  char *str;
  char *local_10;
  
  iVar1 = vasprintf(&local_10,valuefmt,valueap);
  if (iVar1 < 0) {
    pnVar2 = (nvpair_t *)0x0;
  }
  else {
    pnVar2 = nvpair_create_string(name,local_10);
    free(local_10);
  }
  return pnVar2;
}

Assistant:

nvpair_t *
nvpair_create_stringv(const char *name, const char *valuefmt, va_list valueap)
{
	nvpair_t *nvp;
	char *str;
	int len;

	len = nv_vasprintf(&str, valuefmt, valueap);
	if (len < 0)
		return (NULL);
	nvp = nvpair_create_string(name, str);
	nv_free(str);
	return (nvp);
}